

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier>::
streamDefinition(LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier> *this,
                ostringstream *str,GLenum shader)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  GLenum shader_local;
  ostringstream *str_local;
  LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier> *this_local;
  
  if ((-1 < (this->super_LayoutSpecifierBase).val) &&
     (bVar1 = DefOccurence::occurs(&(this->super_LayoutSpecifierBase).occurence,shader), bVar1)) {
    std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,"layout(index = ");
    if ((this->super_LayoutSpecifierBase).numSys == Oct) {
      poVar2 = (ostream *)std::ostream::operator<<(str,std::oct);
      std::operator<<(poVar2,"0");
    }
    else if ((this->super_LayoutSpecifierBase).numSys == Hex) {
      poVar2 = (ostream *)std::ostream::operator<<(str,std::hex);
      std::operator<<(poVar2,"0x");
    }
    this_00 = (void *)std::ostream::operator<<(str,(this->super_LayoutSpecifierBase).val);
    poVar2 = (ostream *)std::ostream::operator<<(this_00,std::dec);
    std::operator<<(poVar2,") ");
  }
  return;
}

Assistant:

void LayoutSpecifier<IndexSpecifier>::streamDefinition(std::ostringstream& str, GLenum shader) const
{
	if (val < 0 || !occurence.occurs(shader))
	{
		return;
	}

	str << "layout(index = ";
	if (numSys == Loc::Oct)
	{
		str << std::oct << "0";
	}
	else if (numSys == Loc::Hex)
	{
		str << std::hex << "0x";
	}
	str << val << std::dec << ") ";
}